

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTables::visit(SemanticTables *this,FormalListNode *formalListNode)

{
  TokenNode *pTVar1;
  char *lexeme;
  FormalListNode *pFVar2;
  bool bVar3;
  int iVar4;
  StructSymbol *pSVar5;
  int size;
  
  pTVar1 = formalListNode->id;
  if (pTVar1 != (TokenNode *)0x0) {
    (*(pTVar1->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar1,this);
  }
  if ((formalListNode->id == (TokenNode *)0x0) ||
     ((formalListNode->id->super_ExpNode).lexeme == (char *)0x0)) {
    visit((SemanticTables *)formalListNode);
  }
  lexeme = (formalListNode->id->super_ExpNode).lexeme;
  iVar4 = formalListNode->type->id->token;
  size = 4;
  if (((1 < iVar4 - 0xbU) && (formalListNode->pointer == (PointerNode *)0x0)) &&
     (size = 1, iVar4 == 10)) {
    pSVar5 = StructTable::cSearch(structTable,(formalListNode->id->super_ExpNode).typeLexeme);
    size = pSVar5->size;
  }
  if (formalListNode->array == (ArrayNode *)0x0) {
    iVar4 = -1;
  }
  else {
    iVar4 = atoi((formalListNode->array->super_ExpNode).lexeme);
    size = size * iVar4;
  }
  bVar3 = VarTable::cInsert(varTable,formalListNode->type,lexeme,
                            formalListNode->pointer != (PointerNode *)0x0,iVar4,true,size);
  if (!bVar3) {
    visit();
  }
  pFVar2 = formalListNode->next;
  if (pFVar2 != (FormalListNode *)0x0) {
    (*(pFVar2->super_ASTNode)._vptr_ASTNode[3])(pFVar2,this);
    return;
  }
  return;
}

Assistant:

void SemanticTables::visit(FormalListNode *formalListNode) {

    if (formalListNode->getId() != NULL) {
        formalListNode->getId()->accept(this);
    }

    if (!formalListNode->getId() || !formalListNode->getId()->getLexeme()) {
        fprintf(stderr, "[SEMANTIC ERROR - formalListNode] FUNCTION PARAMETER WITHOUT A NAME, line: %d\n",
                formalListNode->getLine());
    }

    const char *parameterName = formalListNode->getId()->getLexeme();

    int size = 0;
    // Set var size
    if( formalListNode->getType()->getType() == INT ||formalListNode->getType()->getType() == FLOAT || formalListNode->getPointer() != NULL)
        size = INT32_SIZE;
    else if (formalListNode->getType()->getType() == ID) {
        StructSymbol* structSymbol = structTable->cSearch(formalListNode->getId()->getTypeLexeme());
        size = structSymbol->getSize();
    } else {
        size = INT8_SIZE;
    }

    int arraySize = -1;

    if (formalListNode->getArray()) {
        arraySize = atoi(formalListNode->getArray()->getLexeme());
        size *= arraySize;
    }

    if (!varTable->cInsert(formalListNode->getType(), parameterName, formalListNode->getPointer() != NULL, arraySize,
                           BOOL_TRUE, size)) {
        fprintf(stderr, "[SEMANTIC ERROR - formalListNode] VARIABLE ALREADY EXISTS, line: %d, lexeme: %s \n",
                formalListNode->getLine(), formalListNode->getId()->getLexeme());
    }



    if (formalListNode->getNext() != NULL) {
        formalListNode->getNext()->accept(this);
    }
}